

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::yml::Parser::_location_from_node(Parser *this,Tree *tree,size_t node,Location *loc,size_t level)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  undefined1 uVar6;
  bool bVar7;
  NodeData *pNVar8;
  csubstr *pcVar9;
  char *pcVar10;
  NodeType NVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  pfn_error p_Var15;
  char *val;
  csubstr cVar16;
  char msg [32];
  undefined2 local_d8;
  undefined6 uStack_d6;
  uint uStack_c8;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  size_t local_b0;
  size_t local_88;
  uint uStack_78;
  undefined4 uStack_68;
  undefined4 uStack_64;
  size_t local_60;
  size_t local_38;
  
  pNVar8 = Tree::_p(tree,node);
  if (((pNVar8->m_type).type & KEY) == NOTYPE) {
LAB_001d4e6e:
    pNVar8 = Tree::_p(tree,node);
    if (((pNVar8->m_type).type & VAL) != NOTYPE) {
      pcVar9 = Tree::val(tree,node);
      val = pcVar9->str;
      if (val != (char *)0x0) {
        sVar12 = pcVar9->len;
        pcVar10 = (this->m_buf).str;
        sVar13 = (this->m_buf).len;
        if (sVar13 == 0) {
          if (pcVar10 == val && sVar12 == 0) goto LAB_001d5209;
LAB_001d50a7:
          builtin_strncpy(msg + 0x10,".is_sub(m_buf))",0x10);
          builtin_strncpy(msg,"check failed: (v",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar1 = (code *)swi(3);
            uVar6 = (*pcVar1)();
            return (bool)uVar6;
          }
          p_Var15 = (this->m_stack).m_callbacks.m_error;
          cVar16 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_88 = cVar16.len;
          auVar3 = ZEXT1224(ZEXT412(0x7fb4) << 0x40);
          LVar4.name.str._0_4_ = (int)cVar16.str;
          LVar4.super_LineCol.offset = auVar3._0_8_;
          LVar4.super_LineCol.line = auVar3._8_8_;
          LVar4.super_LineCol.col = auVar3._16_8_;
          LVar4.name.str._4_4_ = cVar16.str._4_4_;
          LVar4.name.len = local_88;
          (*p_Var15)(msg,0x20,LVar4,(this->m_stack).m_callbacks.m_user_data);
          pcVar10 = (this->m_buf).str;
          sVar13 = (this->m_buf).len;
          if (sVar13 != 0) goto LAB_001d515c;
          if (sVar12 == 0 && pcVar10 == val) goto LAB_001d5209;
        }
        else {
          if (val < pcVar10 || pcVar10 + sVar13 < val + sVar12) goto LAB_001d50a7;
LAB_001d515c:
          if (pcVar10 <= val && val + sVar12 <= pcVar10 + sVar13) goto LAB_001d5209;
        }
        builtin_strncpy(msg + 0x10,"_buf.is_super(v)",0x10);
        builtin_strncpy(msg,"check failed: (m",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          uVar6 = (*pcVar1)();
          return (bool)uVar6;
        }
        p_Var15 = (this->m_stack).m_callbacks.m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pvVar14 = (this->m_stack).m_callbacks.m_user_data;
        local_b0 = cVar16.len;
        uStack_c8 = 0x7fb5;
        uStack_b8 = cVar16.str._0_4_;
        uStack_b4 = cVar16.str._4_4_;
LAB_001d51f5:
        local_d8 = 0x29;
        auVar3 = ZEXT424(uStack_c8) << 0x40;
        LVar5.name.str._0_4_ = uStack_b8;
        LVar5.super_LineCol.offset = auVar3._0_8_;
        LVar5.super_LineCol.line = auVar3._8_8_;
        LVar5.super_LineCol.col = auVar3._16_8_;
        LVar5.name.str._4_4_ = uStack_b4;
        LVar5.name.len = local_b0;
        (*p_Var15)(msg,0x22,LVar5,pvVar14);
        goto LAB_001d5209;
      }
    }
    pNVar8 = Tree::_p(tree,node);
    if (((pNVar8->m_type).type & (STREAM|MAP)) == NOTYPE) {
      NVar11 = Tree::type(tree,node);
      if (level != 0) {
        return false;
      }
      if (NVar11.type == NOTYPE) {
        return false;
      }
      sVar12 = Tree::prev_sibling(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar7 = _location_from_node(this,tree,sVar12,loc,1), bVar7)) {
        return true;
      }
      sVar12 = Tree::next_sibling(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar7 = _location_from_node(this,tree,sVar12,loc,1), bVar7)) {
        return true;
      }
      sVar12 = Tree::parent(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar7 = _location_from_node(this,tree,sVar12,loc,1), bVar7)) {
        return true;
      }
      return false;
    }
    _location_from_cont(this,tree,node,loc);
  }
  else {
    pcVar9 = Tree::key(tree,node);
    val = pcVar9->str;
    if (val == (char *)0x0) goto LAB_001d4e6e;
    sVar12 = pcVar9->len;
    pcVar10 = (this->m_buf).str;
    sVar13 = (this->m_buf).len;
    if (sVar13 != 0) {
      if (val < pcVar10 || pcVar10 + sVar13 < val + sVar12) goto LAB_001d4ef2;
LAB_001d4fa7:
      if (pcVar10 <= val && val + sVar12 <= pcVar10 + sVar13) goto LAB_001d5209;
LAB_001d4fc1:
      builtin_strncpy(msg + 0x10,"_buf.is_super(k)",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        uVar6 = (*pcVar1)();
        return (bool)uVar6;
      }
      p_Var15 = (this->m_stack).m_callbacks.m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      pvVar14 = (this->m_stack).m_callbacks.m_user_data;
      local_60 = cVar16.len;
      uStack_78 = 0x7fa9;
      uStack_68 = cVar16.str._0_4_;
      uStack_64 = cVar16.str._4_4_;
      uStack_c8 = uStack_78;
      uStack_b8 = uStack_68;
      uStack_b4 = uStack_64;
      local_b0 = local_60;
      goto LAB_001d51f5;
    }
    if (pcVar10 != val || sVar12 != 0) {
LAB_001d4ef2:
      builtin_strncpy(msg + 0x10,".is_sub(m_buf))",0x10);
      builtin_strncpy(msg,"check failed: (k",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        uVar6 = (*pcVar1)();
        return (bool)uVar6;
      }
      p_Var15 = (this->m_stack).m_callbacks.m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_38 = cVar16.len;
      auVar3 = ZEXT1224(ZEXT412(0x7fa8) << 0x40);
      LVar2.name.str._0_4_ = (int)cVar16.str;
      LVar2.super_LineCol.offset = auVar3._0_8_;
      LVar2.super_LineCol.line = auVar3._8_8_;
      LVar2.super_LineCol.col = auVar3._16_8_;
      LVar2.name.str._4_4_ = cVar16.str._4_4_;
      LVar2.name.len = local_38;
      (*p_Var15)(msg,0x20,LVar2,(this->m_stack).m_callbacks.m_user_data);
      pcVar10 = (this->m_buf).str;
      sVar13 = (this->m_buf).len;
      if (sVar13 != 0) goto LAB_001d4fa7;
      if (sVar12 == 0 && pcVar10 == val) goto LAB_001d5209;
      goto LAB_001d4fc1;
    }
LAB_001d5209:
    val_location((Location *)msg,this,val);
    (loc->name).len = CONCAT62(uStack_d6,local_d8);
    (loc->super_LineCol).col = msg._16_8_;
    (loc->name).str = (char *)msg._24_8_;
    (loc->super_LineCol).offset = msg._0_8_;
    (loc->super_LineCol).line = msg._8_8_;
  }
  return true;
}

Assistant:

bool Parser::_location_from_node(Tree const& tree, size_t node, Location *C4_RESTRICT loc, size_t level) const
{
    if(tree.has_key(node))
    {
        csubstr k = tree.key(node);
        if(C4_LIKELY(k.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, k.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(k));
            *loc = val_location(k.str);
            return true;
        }
    }

    if(tree.has_val(node))
    {
        csubstr v = tree.val(node);
        if(C4_LIKELY(v.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, v.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(v));
            *loc = val_location(v.str);
            return true;
        }
    }

    if(tree.is_container(node))
    {
        if(_location_from_cont(tree, node, loc))
            return true;
    }

    if(tree.type(node) != NOTYPE && level == 0)
    {
        // try the prev sibling
        {
            const size_t prev = tree.prev_sibling(node);
            if(prev != NONE)
            {
                if(_location_from_node(tree, prev, loc, level+1))
                    return true;
            }
        }
        // try the next sibling
        {
            const size_t next = tree.next_sibling(node);
            if(next != NONE)
            {
                if(_location_from_node(tree, next, loc, level+1))
                    return true;
            }
        }
        // try the parent
        {
            const size_t parent = tree.parent(node);
            if(parent != NONE)
            {
                if(_location_from_node(tree, parent, loc, level+1))
                    return true;
            }
        }
    }

    return false;
}